

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O0

TIntermConstantUnion * __thiscall
glslang::TIntermediate::addConstantUnion
          (TIntermediate *this,TString *s,TSourceLoc *loc,bool literal)

{
  TConstUnion *this_00;
  TIntermConstantUnion *pTVar1;
  TType local_d0;
  undefined1 local_38 [8];
  TConstUnionArray unionArray;
  bool literal_local;
  TSourceLoc *loc_local;
  TString *s_local;
  TIntermediate *this_local;
  
  unionArray.unionArray._7_1_ = literal;
  TConstUnionArray::TConstUnionArray((TConstUnionArray *)local_38,1);
  this_00 = TConstUnionArray::operator[]((TConstUnionArray *)local_38,0);
  TConstUnion::setSConst(this_00,s);
  TType::TType(&local_d0,EbtString,EvqConst,1,0,0,false);
  pTVar1 = addConstantUnion(this,(TConstUnionArray *)local_38,&local_d0,loc,
                            (bool)(unionArray.unionArray._7_1_ & 1));
  TType::~TType(&local_d0);
  TConstUnionArray::~TConstUnionArray((TConstUnionArray *)local_38);
  return pTVar1;
}

Assistant:

TIntermConstantUnion* TIntermediate::addConstantUnion(const TString* s, const TSourceLoc& loc, bool literal) const
{
    TConstUnionArray unionArray(1);
    unionArray[0].setSConst(s);

    return addConstantUnion(unionArray, TType(EbtString, EvqConst), loc, literal);
}